

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_type.cpp
# Opt level: O3

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseType
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  pointer puVar1;
  Lexer *pLVar2;
  Token *tokId;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var3;
  size_t sVar4;
  __uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true> _Var5;
  bool bVar6;
  long lVar7;
  Lexer *pLVar8;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *in_RDX;
  Parser *this_00;
  pointer __p;
  _Head_base<0UL,_pfederc::TypeExpr_*,_false> local_90;
  undefined4 uStack_88;
  undefined4 uStack_84;
  Expr *local_80;
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_78;
  Lexer *local_70;
  Position local_68;
  undefined1 local_48 [16];
  
  puVar1 = (caps->_M_t).
           super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
           ._M_t.
           super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
           .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
           super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_68.line =
       *(size_t *)
        &puVar1[3]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_68.startIndex =
       *(size_t *)
        &puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  local_68.endIndex =
       *(size_t *)
        &puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
  sanityExpect((Parser *)caps,TOK_KW_TYPE);
  parseExpression((Parser *)&local_70,(Precedence)caps);
  pLVar8 = local_70;
  if (local_70 == (Lexer *)0x0) {
    puVar1 = (caps->_M_t).
             super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
             ._M_t.
             super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
             .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_90._M_head_impl = (TypeExpr *)operator_new(0x38);
    _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[5]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    *(Level *)&((local_90._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((local_90._M_head_impl)->super_Expr)._vptr_Expr + 4) =
         STX_ERR_INVALID_TYPE_EXPR;
    _Var5.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
         puVar1[4]._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    ((Position *)&((local_90._M_head_impl)->super_Expr).parent)->line =
         (size_t)puVar1[3]._M_t.
                 super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
    ((local_90._M_head_impl)->super_Expr).lexer =
         (Lexer *)_Var5.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
                  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    *(__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
     &((local_90._M_head_impl)->super_Expr).type =
         _Var3.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
         super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
         super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
    (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
     &((local_90._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((local_90._M_head_impl)->super_Expr).pos.startIndex = 0;
    ((local_90._M_head_impl)->super_Expr).pos.endIndex = 0;
    this_00 = (Parser *)&stack0xffffffffffffffc8;
  }
  else {
    if (*(int *)&(local_70->filePath)._M_dataplus._M_p == 0x12) {
      if (local_70->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_0012b990) {
        __cxa_bad_cast();
      }
      if ((short)(local_70->fileContent)._M_string_length == 0x42) {
        lVar7 = *(long *)((long)&(local_70->fileContent).field_2 + 8);
        if (*(int *)(lVar7 + 0x18) == 0) {
          lVar7 = __dynamic_cast(lVar7,&Expr::typeinfo,&TokenExpr::typeinfo,0);
          if (lVar7 == 0) {
LAB_0011a69a:
            __cxa_bad_cast();
          }
          bVar6 = Token::operator==(*(Token **)(lVar7 + 0x38),TOK_ID);
          if (bVar6) {
            Position::operator+(&local_68,(Position *)&(pLVar8->filePath)._M_string_length);
            local_68.endIndex = (size_t)local_80;
            local_68.line = (size_t)local_90._M_head_impl;
            local_68.startIndex = CONCAT44(uStack_84,uStack_88);
            pLVar2 = (Lexer *)(caps->_M_t).
                              super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                              .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
            lVar7 = __dynamic_cast(*(undefined8 *)((long)&(pLVar8->fileContent).field_2 + 8),
                                   &Expr::typeinfo,&TokenExpr::typeinfo,0);
            if (lVar7 == 0) goto LAB_0011a69a;
            tokId = *(Token **)(lVar7 + 0x38);
            local_78._M_t.
            super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
                 (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
                 (pLVar8->fileContent).field_2._M_allocated_capacity;
            (pLVar8->fileContent).field_2._M_allocated_capacity = 0;
            pLVar8 = (Lexer *)operator_new(0x50);
            TypeExpr::TypeExpr((TypeExpr *)pLVar8,pLVar2,&local_68,in_RDX,tokId,
                               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                               &local_78);
            local_90._M_head_impl = (TypeExpr *)0x0;
            this->lexer = pLVar8;
            std::unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_>::~unique_ptr
                      ((unique_ptr<pfederc::TypeExpr,_std::default_delete<pfederc::TypeExpr>_> *)
                       &local_90);
            if (local_78._M_t.
                super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
                (_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)0x0) {
              (**(code **)(*(long *)local_78._M_t.
                                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>
                                    .super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8)
              )();
            }
            goto LAB_0011a673;
          }
          lVar7 = *(long *)((long)&(pLVar8->fileContent).field_2 + 8);
        }
        local_90._M_head_impl = (TypeExpr *)operator_new(0x38);
        sVar4 = *(size_t *)(lVar7 + 0x30);
        *(Level *)&((local_90._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
        *(SyntaxErrorCode *)((long)&((local_90._M_head_impl)->super_Expr)._vptr_Expr + 4) =
             STX_ERR_EXPECTED_ID;
        pLVar8 = *(Lexer **)(lVar7 + 0x28);
        ((Position *)&((local_90._M_head_impl)->super_Expr).parent)->line =
             *(size_t *)(lVar7 + 0x20);
        ((local_90._M_head_impl)->super_Expr).lexer = pLVar8;
        *(size_t *)&((local_90._M_head_impl)->super_Expr).type = sVar4;
        (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
         &((local_90._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data._M_start
             = (pointer)0x0;
        ((local_90._M_head_impl)->super_Expr).pos.startIndex = 0;
        ((local_90._M_head_impl)->super_Expr).pos.endIndex = 0;
        this_00 = (Parser *)local_48;
        goto LAB_0011a644;
      }
    }
    local_90._M_head_impl = (TypeExpr *)operator_new(0x38);
    sVar4 = *(size_t *)((long)&(pLVar8->filePath).field_2 + 8);
    *(Level *)&((local_90._M_head_impl)->super_Expr)._vptr_Expr = LVL_ERROR;
    *(SyntaxErrorCode *)((long)&((local_90._M_head_impl)->super_Expr)._vptr_Expr + 4) =
         STX_ERR_INVALID_TYPE_EXPR;
    pLVar2 = (Lexer *)(pLVar8->filePath).field_2._M_allocated_capacity;
    ((Position *)&((local_90._M_head_impl)->super_Expr).parent)->line =
         (pLVar8->filePath)._M_string_length;
    ((local_90._M_head_impl)->super_Expr).lexer = pLVar2;
    *(size_t *)&((local_90._M_head_impl)->super_Expr).type = sVar4;
    (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
     &((local_90._M_head_impl)->super_Expr).pos.line)->_M_impl).super__Vector_impl_data._M_start =
         (pointer)0x0;
    ((local_90._M_head_impl)->super_Expr).pos.startIndex = 0;
    ((local_90._M_head_impl)->super_Expr).pos.endIndex = 0;
    this_00 = (Parser *)(local_48 + 8);
  }
LAB_0011a644:
  generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)caps);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)this_00);
  if (local_90._M_head_impl != (TypeExpr *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_90,
               (Error<pfederc::SyntaxErrorCode> *)local_90._M_head_impl);
  }
  this->lexer = (Lexer *)0x0;
LAB_0011a673:
  if (local_70 != (Lexer *)0x0) {
    (*local_70->_vptr_Lexer[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseType(std::unique_ptr<Capabilities> &&caps) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_KW_TYPE);

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, lexer.getCurrentToken()->getPosition()));
    return nullptr;
  }

  if (!isBiOpExpr(*expr, TokenType::TOK_OP_NONE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_TYPE_EXPR, expr->getPosition()));
    return nullptr;
  }

  BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);

  if (!isTokenExpr(biopexpr.getRight(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_ID, biopexpr.getRight().getPosition()));
    return nullptr;
  }

  pos = pos + biopexpr.getPosition();

  return std::make_unique<TypeExpr>(lexer, pos, std::move(caps),
      dynamic_cast<const TokenExpr&>(biopexpr.getRight()).getTokenPtr(),
      biopexpr.getLeftPtr());
}